

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_ctpop_i64_m68k(TCGContext_conflict2 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1)

{
  TCGv_i64 arg1_local;
  TCGv_i64 ret_local;
  TCGContext_conflict2 *tcg_ctx_local;
  
  gen_helper_ctpop_i64(tcg_ctx,ret,arg1);
  return;
}

Assistant:

void tcg_gen_ctpop_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1)
{
#if TCG_TARGET_HAS_ctpop_i64
        tcg_gen_op2_i64(tcg_ctx, INDEX_op_ctpop_i64, ret, arg1);
#elif TCG_TARGET_REG_BITS == 32 && TCG_TARGET_HAS_ctpop_i32
        tcg_gen_ctpop_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg1));
        tcg_gen_ctpop_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg1));
        tcg_gen_add_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, ret));
        tcg_gen_movi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), 0);
#else
        gen_helper_ctpop_i64(tcg_ctx, ret, arg1);
#endif
}